

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

ReadFileResult __thiscall
cmCMakePresetsGraph::TestPreset::VisitPresetInherit(TestPreset *this,Preset *parentPreset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__other;
  optional<cmCMakePresetsGraph::TestPreset::FilterOptions> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__other_00;
  IncludeOptions *include;
  IncludeOptions *parentInclude;
  
  if ((this->ConfigurePreset)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfigurePreset);
  }
  if ((this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)((long)&parentPreset[1].Name.field_2 + 8);
  }
  if ((this->Configuration)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->Configuration);
  }
  if ((this->OverwriteConfigurationFile).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->OverwriteConfigurationFile).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->OverwriteConfigurationFile,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&parentPreset[1].OriginFile);
  }
  if (*(char *)&parentPreset[2].Name._M_dataplus._M_p == '\x01') {
    __other = &parentPreset[1].DisplayName.field_2;
    if ((this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_engaged ==
        true) {
      if (*(bool *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload._M_value.ShortProgress + 1) == false) {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.ShortProgress.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)*(_Optional_base<bool,_true,_true> *)__other
        ;
      }
      if (*(char *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload + 8) == '\0') {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.Verbosity.
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum,_true,_true>
             = (_Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum,_true,_true,_true>
                )((_Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum,_true,_true>
                   *)((long)&parentPreset[1].DisplayName.field_2 + 4))->_M_payload;
      }
      if (*(bool *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload._M_value.Debug + 1) == false) {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.Debug.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             ((_Optional_base<bool,_true,_true> *)((long)&parentPreset[1].DisplayName.field_2 + 0xc)
             )->_M_payload;
      }
      if (*(bool *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload._M_value.OutputOnFailure + 1) == false) {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.OutputOnFailure.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             ((_Optional_base<bool,_true,_true> *)((long)&parentPreset[1].DisplayName.field_2 + 0xe)
             )->_M_payload;
      }
      if (*(bool *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload._M_value.Quiet + 1) == false) {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.Quiet.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             *(_Optional_base<bool,_true,_true> *)&parentPreset[1].Description._M_dataplus._M_p;
      }
      if (*(size_type *)
           ((long)&(this->Output).
                   super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                   ._M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                   .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                   _M_payload._M_value.OutputLogFile + 8) == 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->Output).
                    super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                    ._M_payload.
                    super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                    .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                    _M_payload._M_value.OutputLogFile);
      }
      if (*(size_type *)
           ((long)&(this->Output).
                   super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                   ._M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                   .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                   _M_payload._M_value.OutputJUnitFile + 8) == 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->Output).
                    super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                    ._M_payload.
                    super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                    .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>.
                    _M_payload._M_value.OutputJUnitFile);
      }
      if (*(bool *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload._M_value.LabelSummary + 1) == false) {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.LabelSummary.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             *(_Optional_base<bool,_true,_true> *)
              &parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      if (*(bool *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload._M_value.SubprojectSummary + 1) == false) {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.SubprojectSummary.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             ((_Optional_base<bool,_true,_true> *)
             ((long)&parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent + 2))->_M_payload;
      }
      if (*(char *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload + 0x60) == '\0') {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.MaxPassedTestOutputSize.super__Optional_base<int,_true,_true> =
             (_Optional_payload<int,_true,_true,_true>)
             ((_Optional_base<int,_true,_true> *)
             ((long)&parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent + 4))->_M_payload;
      }
      if (*(char *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload + 0x68) == '\0') {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.MaxFailedTestOutputSize.super__Optional_base<int,_true,_true> =
             (_Optional_payload<int,_true,_true,_true>)
             ((_Optional_base<int,_true,_true> *)
             ((long)&parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_left + 4))->_M_payload;
      }
      if (*(char *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload + 0x70) == '\0') {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.TestOutputTruncation.super__Optional_base<cmCTestTypes::TruncationMode,_true,_true>
             = (_Optional_payload<cmCTestTypes::TruncationMode,_true,_true,_true>)
               ((_Optional_base<cmCTestTypes::TruncationMode,_true,_true> *)
               ((long)&parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_right + 4))->_M_payload;
      }
      if (*(char *)((long)&(this->Output).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>
                           ._M_payload + 0x78) == '\0') {
        (this->Output).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_payload.
        _M_value.MaxTestNameWidth.super__Optional_base<int,_true,_true> =
             (_Optional_payload<int,_true,_true,_true>)
             ((_Optional_base<int,_true,_true> *)
             ((long)&parentPreset[1].Environment._M_t._M_impl.super__Rb_tree_header._M_node_count +
             4))->_M_payload;
      }
    }
    else {
      std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>::_M_copy_assign
                ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
                 &this->Output,
                 (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions> *)__other);
    }
  }
  if (*(char *)&parentPreset[3].ConditionEvaluator.
                super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != '\x01') goto LAB_00225a56;
  if ((char)parentPreset[2].Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_color ==
      _S_black) {
    this_00 = &this->Filter;
    if ((this->Filter).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged ==
        true) {
      if (*(char *)((long)&(this->Filter).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                           ._M_payload + 0xa0) == '\x01') {
        if (*(long *)((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload + 8) == 0) {
          std::__cxx11::string::_M_assign((string *)this_00);
        }
        if (*(long *)((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload + 0x28) == 0) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload._M_value.Include + 0x20));
        }
        if (*(char *)((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload + 0x90) == '\0') {
          std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
          ::_M_copy_assign((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                            *)((long)&(this->Filter).
                                      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                                      ._M_payload._M_value.Include + 0x40),
                           (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                            *)&parentPreset[2].DisplayName);
        }
        goto LAB_002259b1;
      }
    }
    else {
      memset(this_00,0,0x158);
      (this->Filter).
      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged = true
      ;
    }
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions>::_M_copy_assign
              ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions> *)this_00,
               (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions> *)
               &parentPreset[2].Name._M_string_length);
  }
LAB_002259b1:
  if (parentPreset[3].Description.field_2._M_local_buf[8] == '\x01') {
    if ((this->Filter).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
        super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged ==
        true) {
      if (*(char *)((long)&(this->Filter).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                           ._M_payload + 0x150) == '\x01') {
        if (*(long *)((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload + 0xb0) == 0) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(this->Filter).
                      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                      ._M_payload.
                      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>.
                      _M_payload._M_value.Exclude);
        }
        if (*(long *)((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload + 0xd0) == 0) {
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload._M_value.Exclude + 0x20));
        }
        if (*(char *)((long)&(this->Filter).
                             super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                             ._M_payload.
                             super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                             .
                             super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                             ._M_payload + 0x148) == '\0') {
          std::
          _Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>::
          _M_copy_assign((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                          *)((long)&(this->Filter).
                                    super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>
                                    ._M_payload._M_value.Exclude + 0x40),
                         (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions::FixturesOptions>
                          *)((long)&parentPreset[3].Name.field_2 + 8));
        }
        goto LAB_00225a56;
      }
    }
    else {
      memset(&this->Filter,0,0x158);
      (this->Filter).
      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged = true
      ;
    }
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions>::_M_copy_assign
              ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions> *)
               &(this->Filter).
                super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>.
                _M_payload.
                super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>
                .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>.
                _M_payload._M_value.Exclude,
               (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExcludeOptions> *)
               &parentPreset[2].Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  }
LAB_00225a56:
  if (parentPreset[4].Name.field_2._M_local_buf[8] == '\x01') {
    __other_00 = &parentPreset[3].ConditionEvaluator.
                  super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
    if ((this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_engaged
        == true) {
      if (*(bool *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload._M_value.StopOnFailure + 1) == false) {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.StopOnFailure.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             *(_Optional_base<bool,_true,_true> *)&__other_00->_M_pi;
      }
      if (*(bool *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload._M_value.EnableFailover + 1) == false) {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.EnableFailover.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             ((_Optional_base<bool,_true,_true> *)
             ((long)&parentPreset[3].ConditionEvaluator.
                     super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 2))->_M_payload;
      }
      if (*(char *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload + 8) == '\0') {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.Jobs.super__Optional_base<int,_true,_true> =
             (_Optional_payload<int,_true,_true,_true>)
             ((_Optional_base<int,_true,_true> *)
             ((long)&parentPreset[3].ConditionEvaluator.
                     super___shared_ptr<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4))->_M_payload;
      }
      if (*(size_type *)
           ((long)&(this->Execution).
                   super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                   ._M_payload.
                   super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                   .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>.
                   _M_payload._M_value.ResourceSpecFile + 8) == 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->Execution).
                    super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                    ._M_payload.
                    super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                    .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                    ._M_payload._M_value.ResourceSpecFile);
      }
      if (*(char *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload + 0x34) == '\0') {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.TestLoad.super__Optional_base<int,_true,_true> =
             (_Optional_base<int,_true,_true>)
             parentPreset[3].Environment._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      }
      if (*(char *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload + 0x3c) == '\0') {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.ShowOnly.
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum,_true,_true>
             = (_Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions::ShowOnlyEnum,_true,_true>
                )parentPreset[3].Environment._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      if (*(char *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload + 0x48) == '\0') {
        *(undefined4 *)
         ((long)&(this->Execution).
                 super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                 ._M_payload.
                 super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                 .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>.
                 _M_payload + 0x48) = *(undefined4 *)&parentPreset[4].Name._M_dataplus._M_p;
        *(_func_int ***)
         &(this->Execution).
          super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
          _M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
          .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>.
          _M_payload._M_value.Repeat.
          super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions::RepeatOptions,_true,_true>
             = parentPreset[4]._vptr_Preset;
      }
      if (*(bool *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload._M_value.InteractiveDebugging + 1) == false) {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.InteractiveDebugging.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             ((_Optional_base<bool,_true,_true> *)((long)&parentPreset[4].Name._M_dataplus._M_p + 4)
             )->_M_payload;
      }
      if (*(bool *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload._M_value.ScheduleRandom + 1) == false) {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.ScheduleRandom.super__Optional_base<bool,_true,_true> =
             (_Optional_payload<bool,_true,_true,_true>)
             ((_Optional_base<bool,_true,_true> *)((long)&parentPreset[4].Name._M_dataplus._M_p + 6)
             )->_M_payload;
      }
      if (*(char *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload + 0x54) == '\0') {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.Timeout.super__Optional_base<int,_true,_true> =
             (_Optional_base<int,_true,_true>)parentPreset[4].Name._M_string_length;
      }
      if (*(char *)((long)&(this->Execution).
                           super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                           ._M_payload.
                           super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
                           .
                           super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>
                           ._M_payload + 0x5c) == '\0') {
        (this->Execution).
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>.
        _M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>._M_payload.
        _M_value.NoTestsAction.
        super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions::NoTestsActionEnum,_true,_true>
             = (_Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions::NoTestsActionEnum,_true,_true>
                )parentPreset[4].Name.field_2._M_allocated_capacity;
      }
    }
    else {
      std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions>::_M_copy_assign
                ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions> *)
                 &this->Execution,
                 (_Optional_payload_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions> *)
                 __other_00);
    }
  }
  return READ_OK;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult
cmCMakePresetsGraph::TestPreset::VisitPresetInherit(
  const cmCMakePresetsGraph::Preset& parentPreset)
{
  auto& preset = *this;
  const TestPreset& parent = static_cast<const TestPreset&>(parentPreset);

  InheritString(preset.ConfigurePreset, parent.ConfigurePreset);
  InheritOptionalValue(preset.InheritConfigureEnvironment,
                       parent.InheritConfigureEnvironment);
  InheritString(preset.Configuration, parent.Configuration);
  InheritVector(preset.OverwriteConfigurationFile,
                parent.OverwriteConfigurationFile);

  if (parent.Output) {
    if (preset.Output) {
      auto& output = preset.Output.value();
      const auto& parentOutput = parent.Output.value();
      InheritOptionalValue(output.ShortProgress, parentOutput.ShortProgress);
      InheritOptionalValue(output.Verbosity, parentOutput.Verbosity);
      InheritOptionalValue(output.Debug, parentOutput.Debug);
      InheritOptionalValue(output.OutputOnFailure,
                           parentOutput.OutputOnFailure);
      InheritOptionalValue(output.Quiet, parentOutput.Quiet);
      InheritString(output.OutputLogFile, parentOutput.OutputLogFile);
      InheritString(output.OutputJUnitFile, parentOutput.OutputJUnitFile);
      InheritOptionalValue(output.LabelSummary, parentOutput.LabelSummary);
      InheritOptionalValue(output.SubprojectSummary,
                           parentOutput.SubprojectSummary);
      InheritOptionalValue(output.MaxPassedTestOutputSize,
                           parentOutput.MaxPassedTestOutputSize);
      InheritOptionalValue(output.MaxFailedTestOutputSize,
                           parentOutput.MaxFailedTestOutputSize);
      InheritOptionalValue(output.TestOutputTruncation,
                           parentOutput.TestOutputTruncation);
      InheritOptionalValue(output.MaxTestNameWidth,
                           parentOutput.MaxTestNameWidth);
    } else {
      preset.Output = parent.Output;
    }
  }

  if (parent.Filter) {
    if (parent.Filter->Include) {
      if (preset.Filter && preset.Filter->Include) {
        auto& include = *preset.Filter->Include;
        const auto& parentInclude = *parent.Filter->Include;
        InheritString(include.Name, parentInclude.Name);
        InheritString(include.Label, parentInclude.Label);
        InheritOptionalValue(include.Index, parentInclude.Index);
      } else {
        if (!preset.Filter) {
          preset.Filter.emplace();
        }
        preset.Filter->Include = parent.Filter->Include;
      }
    }

    if (parent.Filter->Exclude) {
      if (preset.Filter && preset.Filter->Exclude) {
        auto& exclude = *preset.Filter->Exclude;
        const auto& parentExclude = *parent.Filter->Exclude;
        InheritString(exclude.Name, parentExclude.Name);
        InheritString(exclude.Label, parentExclude.Label);
        InheritOptionalValue(exclude.Fixtures, parentExclude.Fixtures);
      } else {
        if (!preset.Filter) {
          preset.Filter.emplace();
        }
        preset.Filter->Exclude = parent.Filter->Exclude;
      }
    }
  }

  if (parent.Execution) {
    if (preset.Execution) {
      auto& execution = *preset.Execution;
      const auto& parentExecution = *parent.Execution;
      InheritOptionalValue(execution.StopOnFailure,
                           parentExecution.StopOnFailure);
      InheritOptionalValue(execution.EnableFailover,
                           parentExecution.EnableFailover);
      InheritOptionalValue(execution.Jobs, parentExecution.Jobs);
      InheritString(execution.ResourceSpecFile,
                    parentExecution.ResourceSpecFile);
      InheritOptionalValue(execution.TestLoad, parentExecution.TestLoad);
      InheritOptionalValue(execution.ShowOnly, parentExecution.ShowOnly);
      InheritOptionalValue(execution.Repeat, parentExecution.Repeat);
      InheritOptionalValue(execution.InteractiveDebugging,
                           parentExecution.InteractiveDebugging);
      InheritOptionalValue(execution.ScheduleRandom,
                           parentExecution.ScheduleRandom);
      InheritOptionalValue(execution.Timeout, parentExecution.Timeout);
      InheritOptionalValue(execution.NoTestsAction,
                           parentExecution.NoTestsAction);
    } else {
      preset.Execution = parent.Execution;
    }
  }

  return ReadFileResult::READ_OK;
}